

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O2

prod_bitset * __thiscall
CppGenerator::computeDependentLoops
          (prod_bitset *__return_storage_ptr__,CppGenerator *this,size_t view_id,
          prod_bitset presentFunctions,var_bitset relationBag,dyn_bitset *contributingViews,
          var_bitset varOrderBitset,dyn_bitset addedOutLoops,size_t thisLoopID)

{
  ulong *puVar1;
  pointer pdVar2;
  pointer puVar3;
  byte bVar4;
  var_bitset varOrderBitset_00;
  var_bitset varOrderBitset_01;
  dyn_bitset addedOutLoops_00;
  dyn_bitset addedOutLoops_01;
  _WordT _Var5;
  _WordT _Var6;
  prod_bitset *ppVar7;
  bool bVar8;
  bool bVar9;
  size_t sVar10;
  Function *pFVar11;
  View *pVVar12;
  size_type sVar13;
  pointer pDVar14;
  size_type sVar15;
  ostream *poVar16;
  long lVar17;
  ulong uVar18;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *b;
  undefined8 *puVar19;
  undefined8 *puVar20;
  size_t *potNextLoop_1;
  pointer puVar21;
  size_t v;
  ulong uVar22;
  ulong uVar23;
  size_t incID;
  ulong v_id;
  ulong uVar24;
  byte bVar25;
  _Base_bitset<24UL> in_stack_fffffffffffff9b8;
  pointer in_stack_fffffffffffffa98;
  vector<DependentLoop,_std::allocator<DependentLoop>_> *this_00;
  CppGenerator *this_01;
  CppGenerator *thisLoopID_00;
  dyn_bitset nextConsideredLoops;
  size_t nextLoopID;
  ulong local_4c8;
  prod_bitset *local_4c0;
  dyn_bitset nonAddedOutLoops;
  dyn_bitset loopFactors;
  var_bitset relationBag_local;
  dyn_bitset nextLoops;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_428;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_408;
  dyn_bitset remainingLoops;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_398;
  size_type local_378;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_2b0;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_290;
  prod_bitset loopFunctionMask;
  undefined8 local_1b0 [24];
  undefined8 local_f0 [24];
  
  relationBag_local.super__Base_bitset<2UL>._M_w[1] = relationBag.super__Base_bitset<2UL>._M_w[1];
  relationBag_local.super__Base_bitset<2UL>._M_w[0] = relationBag.super__Base_bitset<2UL>._M_w[0];
  bVar25 = 0;
  local_4c0 = __return_storage_ptr__;
  sVar10 = QueryCompiler::numberOfViews
                     ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&loopFactors,sVar10 + 1,0,(allocator<unsigned_long> *)&remainingLoops);
  sVar10 = QueryCompiler::numberOfViews
                     ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&nextLoops,sVar10 + 1,0,(allocator<unsigned_long> *)&remainingLoops);
  memset(&loopFunctionMask,0,0xc0);
  pDVar14 = (this->depListOfLoops).super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>
            ._M_impl.super__Vector_impl_data._M_start;
  sVar10 = QueryCompiler::numberOfViews
                     ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  this_00 = &this->depListOfLoops;
  b = &pDVar14[(long)addedOutLoops.m_bits.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish].loopFactors;
  do {
    local_4c8 = sVar10;
    if (local_4c8 == 0) break;
    sVar10 = local_4c8 - 1;
  } while (((b->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[local_4c8 >> 6] >> (local_4c8 & 0x3f) & 1) == 0);
  pdVar2 = (this->outViewLoop).
           super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
            (&remainingLoops,
             (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
             addedOutLoops.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start);
  boost::operator&(&nonAddedOutLoops,pdVar2 + view_id,&remainingLoops);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&remainingLoops);
  uVar24 = 0;
  this_01 = this;
LAB_001bcece:
  if (uVar24 == 0x5dc) {
    std::bitset<1500UL>::operator~
              ((bitset<1500UL> *)&remainingLoops,
               (bitset<1500UL> *)&loopFunctionMask.super__Base_bitset<24UL>);
    std::_Base_bitset<24UL>::_M_do_and
              (&presentFunctions.super__Base_bitset<24UL>,(_Base_bitset<24UL> *)&remainingLoops);
    pDVar14 = (this_00->super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>)._M_impl.
              super__Vector_impl_data._M_start +
              (long)addedOutLoops.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish;
    bVar8 = std::_Base_bitset<24UL>::_M_is_any(&loopFunctionMask.super__Base_bitset<24UL>);
    if (bVar8) {
      remainingLoops.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)view_id;
      memcpy(&remainingLoops.m_bits.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish,&loopFunctionMask,0xc0);
      std::
      vector<std::pair<unsigned_long,std::bitset<1500ul>>,std::allocator<std::pair<unsigned_long,std::bitset<1500ul>>>>
      ::emplace_back<std::pair<unsigned_long,std::bitset<1500ul>>>
                ((vector<std::pair<unsigned_long,std::bitset<1500ul>>,std::allocator<std::pair<unsigned_long,std::bitset<1500ul>>>>
                  *)pDVar14,(pair<unsigned_long,_std::bitset<1500UL>_> *)&remainingLoops);
    }
    uVar24 = 0;
    do {
      sVar10 = QueryCompiler::numberOfViews
                         ((this_01->_qc).
                          super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      if (sVar10 + 1 <= uVar24) {
        bVar8 = boost::operator==((this_01->outViewLoop).
                                  super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + view_id,b);
        if (bVar8) {
          puVar1 = (ulong *)(*(long *)&(this_00->
                                       super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>
                                       )._M_impl.super__Vector_impl_data._M_start
                                       [(long)addedOutLoops.m_bits.
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data._M_finish].outView.
                                       m_bits.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                            + (view_id >> 6) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)view_id & 0x3f);
        }
        bVar8 = boost::operator==(b,(dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *
                                    )addedOutLoops.m_bits.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
        if (((bVar8) &&
            (bVar8 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::any
                               (&nonAddedOutLoops), bVar8)) &&
           (sVar15 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                     find_first(&nonAddedOutLoops), sVar15 != 0xffffffffffffffff)) {
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                    (&nextConsideredLoops,b);
          uVar24 = 1L << ((byte)sVar15 & 0x3f);
          nextConsideredLoops.m_bits.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[sVar15 >> 6] =
               nextConsideredLoops.m_bits.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[sVar15 >> 6] | uVar24;
          puVar3 = *(pointer *)
                    ((long)&(pDVar14->next).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl + 8);
          bVar8 = false;
          for (puVar21 = *(pointer *)
                          &(pDVar14->next).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
              ; puVar21 != puVar3; puVar21 = puVar21 + 1) {
            bVar9 = boost::operator==(&(this_00->
                                       super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>
                                       )._M_impl.super__Vector_impl_data._M_start[*puVar21].
                                       loopFactors,&nextConsideredLoops);
            if (bVar9) {
              nextLoopID = *puVar21;
              bVar8 = true;
            }
          }
          thisLoopID_00 = this_01;
          if (!bVar8) {
            nextLoopID = ((long)(this_01->depListOfLoops).
                                super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this_01->depListOfLoops).
                               super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>.
                               _M_impl.super__Vector_impl_data._M_start) / 0x138;
            sVar10 = QueryCompiler::numberOfViews
                               ((this_01->_qc).
                                super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                               );
            DependentLoop::DependentLoop((DependentLoop *)&remainingLoops,sVar10);
            boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                      (&local_398,&nextConsideredLoops);
            local_378 = sVar15;
            std::vector<DependentLoop,_std::allocator<DependentLoop>_>::push_back
                      (this_00,(value_type *)&remainingLoops);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      (&(this_00->super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>)
                        ._M_impl.super__Vector_impl_data._M_start
                        [(long)addedOutLoops.m_bits.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish].next,&nextLoopID);
            DependentLoop::~DependentLoop((DependentLoop *)&remainingLoops);
          }
          puVar1 = (ulong *)(*addedOutLoops.m_bits.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start + (sVar15 >> 6) * 8);
          *puVar1 = *puVar1 | uVar24;
          memcpy(local_1b0,&presentFunctions,0xc0);
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                    (&local_428,contributingViews);
          _Var6 = varOrderBitset.super__Base_bitset<2UL>._M_w[1];
          _Var5 = varOrderBitset.super__Base_bitset<2UL>._M_w[0];
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                    (&local_408,
                     (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                     addedOutLoops.m_bits.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start);
          sVar10 = nextLoopID;
          puVar19 = local_1b0;
          puVar20 = (undefined8 *)&stack0xfffffffffffff9b8;
          for (lVar17 = 0x18; lVar17 != 0; lVar17 = lVar17 + -1) {
            *puVar20 = *puVar19;
            puVar19 = puVar19 + (ulong)bVar25 * -2 + 1;
            puVar20 = puVar20 + (ulong)bVar25 * -2 + 1;
          }
          varOrderBitset_01.super__Base_bitset<2UL>._M_w[1] = _Var6;
          varOrderBitset_01.super__Base_bitset<2UL>._M_w[0] = _Var5;
          addedOutLoops_01.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)sVar10;
          addedOutLoops_01.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)&local_408;
          addedOutLoops_01.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffa98;
          addedOutLoops_01.m_num_bits = (size_type)this_00;
          computeDependentLoops
                    ((prod_bitset *)&remainingLoops,this_01,view_id,
                     (prod_bitset)in_stack_fffffffffffff9b8._M_w,relationBag,&local_428,
                     varOrderBitset_01,addedOutLoops_01,(size_t)thisLoopID_00);
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                    ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_408);
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                    ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_428);
          std::_Base_bitset<24UL>::_M_do_or
                    (&(this_00->super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>).
                      _M_impl.super__Vector_impl_data._M_start
                      [(long)addedOutLoops.m_bits.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish].branchFunctions.
                      super__Base_bitset<24UL>,(_Base_bitset<24UL> *)&remainingLoops);
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                    ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                     &nextConsideredLoops);
        }
        ppVar7 = local_4c0;
        memcpy(local_4c0,
               &(this_00->super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>)._M_impl
                .super__Vector_impl_data._M_start
                [(long)addedOutLoops.m_bits.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish].branchFunctions,0xc0);
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&nonAddedOutLoops)
        ;
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&nextLoops);
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&loopFactors);
        return ppVar7;
      }
      uVar18 = 1L << ((byte)uVar24 & 0x3f);
      uVar22 = uVar24 >> 6;
      if ((nextLoops.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar22] >> (uVar24 & 0x3f) & 1) != 0) {
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                  (&nextConsideredLoops,b);
        nextConsideredLoops.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar22] =
             nextConsideredLoops.m_bits.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar22] | uVar18;
        if ((*(ulong *)(*(long *)&(this_01->outViewLoop).
                                  super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[view_id].m_bits.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl + uVar22 * 8) & uVar18) != 0) {
          std::operator<<((ostream *)&std::cerr,
                          "THERE IS A MISTAKE WITH NEXT CONSIDERED LOOPS IN DEP COMP\n");
LAB_001bd880:
          exit(1);
        }
        puVar3 = *(pointer *)
                  ((long)&(pDVar14->next).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  + 8);
        bVar8 = false;
        for (puVar21 = *(pointer *)
                        &(pDVar14->next).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl;
            puVar21 != puVar3; puVar21 = puVar21 + 1) {
          bVar9 = boost::operator==(&(this_00->
                                     super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>
                                     )._M_impl.super__Vector_impl_data._M_start[*puVar21].
                                     loopFactors,&nextConsideredLoops);
          if (bVar9) {
            nextLoopID = *puVar21;
            bVar8 = true;
          }
        }
        if (!bVar8) {
          nextLoopID = ((long)(this_01->depListOfLoops).
                              super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this_01->depListOfLoops).
                             super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>.
                             _M_impl.super__Vector_impl_data._M_start) / 0x138;
          sVar10 = QueryCompiler::numberOfViews
                             ((this_01->_qc).
                              super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          DependentLoop::DependentLoop((DependentLoop *)&remainingLoops,sVar10);
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                    (&local_398,&nextConsideredLoops);
          local_378 = uVar24;
          std::vector<DependentLoop,_std::allocator<DependentLoop>_>::push_back
                    (this_00,(value_type *)&remainingLoops);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    (&(this_00->super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>).
                      _M_impl.super__Vector_impl_data._M_start
                      [(long)addedOutLoops.m_bits.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish].next,&nextLoopID);
          DependentLoop::~DependentLoop((DependentLoop *)&remainingLoops);
        }
        memcpy(local_f0,&presentFunctions,0xc0);
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                  (&local_290,contributingViews);
        _Var6 = varOrderBitset.super__Base_bitset<2UL>._M_w[1];
        _Var5 = varOrderBitset.super__Base_bitset<2UL>._M_w[0];
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                  (&local_2b0,
                   (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                   addedOutLoops.m_bits.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start);
        sVar10 = nextLoopID;
        puVar19 = local_f0;
        puVar20 = (undefined8 *)&stack0xfffffffffffff9b8;
        for (lVar17 = 0x18; lVar17 != 0; lVar17 = lVar17 + -1) {
          *puVar20 = *puVar19;
          puVar19 = puVar19 + (ulong)bVar25 * -2 + 1;
          puVar20 = puVar20 + (ulong)bVar25 * -2 + 1;
        }
        varOrderBitset_00.super__Base_bitset<2UL>._M_w[1] = _Var6;
        varOrderBitset_00.super__Base_bitset<2UL>._M_w[0] = _Var5;
        addedOutLoops_00.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)sVar10;
        addedOutLoops_00.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)&local_2b0;
        addedOutLoops_00.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffa98;
        addedOutLoops_00.m_num_bits = (size_type)this_00;
        computeDependentLoops
                  ((prod_bitset *)&remainingLoops,this_01,view_id,
                   (prod_bitset)in_stack_fffffffffffff9b8._M_w,relationBag,&local_290,
                   varOrderBitset_00,addedOutLoops_00,(size_t)this_01);
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_2b0);
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_290);
        std::_Base_bitset<24UL>::_M_do_or
                  (&(this_00->super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>).
                    _M_impl.super__Vector_impl_data._M_start
                    [(long)addedOutLoops.m_bits.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish].branchFunctions.
                    super__Base_bitset<24UL>,(_Base_bitset<24UL> *)&remainingLoops);
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                   &nextConsideredLoops);
      }
      uVar24 = uVar24 + 1;
    } while( true );
  }
  if ((presentFunctions.super__Base_bitset<24UL>._M_w[uVar24 >> 6] >> (uVar24 & 0x3f) & 1) == 0)
  goto LAB_001bd1a9;
  pFVar11 = QueryCompiler::getFunction
                      ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,uVar24);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reset(&loopFactors);
  for (uVar22 = 0; uVar22 != 100; uVar22 = uVar22 + 1) {
    uVar23 = uVar22 >> 6;
    uVar18 = 1L << ((byte)uVar22 & 0x3f);
    if ((((pFVar11->_fVars).super__Base_bitset<2UL>._M_w[uVar23] >> (uVar22 & 0x3f) & 1) != 0) &&
       ((varOrderBitset.super__Base_bitset<2UL>._M_w[uVar23] & uVar18) == 0)) {
      if ((relationBag_local.super__Base_bitset<2UL>._M_w[uVar23] & uVar18) == 0) {
        for (v_id = 0;
            sVar10 = QueryCompiler::numberOfViews
                               ((this->_qc).
                                super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                               ), v_id < sVar10; v_id = v_id + 1) {
          bVar4 = (byte)v_id;
          this = this_01;
          if ((((contributingViews->m_bits).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[v_id >> 6] >> (v_id & 0x3f) & 1) != 0) &&
             (pVVar12 = QueryCompiler::getView
                                  ((this_01->_qc).
                                   super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr,v_id), this = this_01,
             ((pVVar12->_fVars).super__Base_bitset<2UL>._M_w[uVar23] & uVar18) != 0)) {
            uVar18 = (v_id >> 6) << 3;
            goto LAB_001bcf82;
          }
          this_01 = this;
        }
      }
      else {
        sVar10 = QueryCompiler::numberOfViews
                           ((this->_qc).
                            super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        bVar4 = (byte)sVar10;
        uVar18 = sVar10 >> 3 & 0xfffffffffffffff8;
        this = this_01;
LAB_001bcf82:
        *(ulong *)(uVar18 + (long)loopFactors.m_bits.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start) =
             *(ulong *)(uVar18 + (long)loopFactors.m_bits.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_start) |
             1L << (bVar4 & 0x3f);
        this_01 = this;
      }
    }
  }
  boost::operator&(&remainingLoops,&loopFactors,&nonAddedOutLoops);
  bVar8 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::any(&remainingLoops)
  ;
  if (!bVar8) {
    bVar8 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::any
                      (&nonAddedOutLoops);
    if (bVar8) {
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&nextLoopID,
                 (this->outViewLoop).
                 super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + view_id);
      boost::operator&(&nextConsideredLoops,&loopFactors,
                       (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&nextLoopID)
      ;
      bVar8 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::any
                        (&nextConsideredLoops);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&nextConsideredLoops
                );
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&nextLoopID);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&remainingLoops);
      if (bVar8) goto LAB_001bd1a9;
    }
    else {
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&remainingLoops);
    }
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator|=
              (&loopFactors,
               (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
               addedOutLoops.m_bits.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start);
    bVar8 = boost::operator==(&loopFactors,b);
    if (bVar8) {
      std::bitset<1500UL>::set(&loopFunctionMask,uVar24,true);
      goto LAB_001bd1a9;
    }
    boost::operator&(&remainingLoops,b,&loopFactors);
    bVar8 = boost::operator==(&remainingLoops,b);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&remainingLoops);
    if (!bVar8) goto LAB_001bd1a9;
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
              (&nextConsideredLoops,b);
    boost::operator&(&remainingLoops,&loopFactors,&nextConsideredLoops);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&nextConsideredLoops);
    bVar8 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::any
                      (&remainingLoops);
    if (!bVar8) goto LAB_001bd037;
    sVar13 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_next
                       (&remainingLoops,local_4c8);
    if (sVar13 == 0xffffffffffffffff) {
      poVar16 = std::operator<<((ostream *)&std::cerr,
                                "We found a remaining Loop which is not higher ");
      std::operator<<(poVar16," than the highest considered loop?!\n");
      goto LAB_001bd880;
    }
    nextLoops.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[sVar13 >> 6] =
         nextLoops.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start[sVar13 >> 6] | 1L << ((byte)sVar13 & 0x3f);
  }
LAB_001bd037:
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&remainingLoops);
LAB_001bd1a9:
  uVar24 = uVar24 + 1;
  goto LAB_001bcece;
}

Assistant:

prod_bitset CppGenerator::computeDependentLoops(
    size_t view_id, prod_bitset presentFunctions, var_bitset relationBag,
    dyn_bitset contributingViews, var_bitset varOrderBitset,
    dyn_bitset addedOutLoops, size_t thisLoopID)
{
    dyn_bitset loopFactors(_qc->numberOfViews()+1);
    dyn_bitset nextLoops(_qc->numberOfViews()+1);

    prod_bitset loopFunctionMask;

    const dyn_bitset& consideredLoops = depListOfLoops[thisLoopID].loopFactors;

    size_t highestPosition = 0;
    // need to continue with this the next loop
    for (size_t view=_qc->numberOfViews(); view > 0; view--)
    {
        if (consideredLoops[view])
        {
            highestPosition = view;
            break;
        }
    }

    
    dyn_bitset nonAddedOutLoops = outViewLoop[view_id] & ~addedOutLoops;

    // then find all loops required to compute these functions and create masks
    for (size_t f = 0; f < NUM_OF_FUNCTIONS; f++)
    {
        if (presentFunctions[f])
        {
            const var_bitset& functionVars = _qc->getFunction(f)->_fVars;
            loopFactors.reset();
            
            for (size_t v = 0; v < NUM_OF_VARIABLES; ++v)
            {
                if (functionVars[v] && !varOrderBitset[v])
                {
                    if (relationBag[v])
                        loopFactors.set(_qc->numberOfViews());
                    else
                    {
                        for (size_t incID = 0; incID < _qc->numberOfViews(); ++incID)
                        {
                            if (contributingViews[incID])
                            {
                                View* incView = _qc->getView(incID);
                                const var_bitset& incViewBitset = incView->_fVars;
                                if (incViewBitset[v])
                                {
                                    loopFactors.set(incID);
                                    break;
                                }
                            }
                        }
                    }
                }
            }

            // TODO: TODO: Consider this again 
            if ((loopFactors & nonAddedOutLoops).any() ||
                (nonAddedOutLoops.any() && (loopFactors & ~outViewLoop[view_id]).any()))
                continue;
            
            loopFactors |= addedOutLoops;
            
            if (loopFactors == consideredLoops)
            {
                // Add this function to the mask for this loop
                loopFunctionMask.set(f);
            }
            else
            {
                if ((consideredLoops & loopFactors) == consideredLoops)
                {
                    dyn_bitset remainingLoops = loopFactors & ~consideredLoops;
                    if (remainingLoops.any())
                    {
                        size_t next = remainingLoops.find_next(highestPosition);
                        if (next != boost::dynamic_bitset<>::npos)
                            nextLoops.set(next);
                        else
                        {
                            ERROR("We found a remaining Loop which is not higher " <<
                                  " than the highest considered loop?!\n");
                            exit(1);
                        }
                    }
                }
            }
        }
    }
    
    presentFunctions &= ~loopFunctionMask;
    
    // Then use the registrar to split the functions to their loops
    DependentLoop& depLoop = depListOfLoops[thisLoopID];
    if (loopFunctionMask.any())
        depLoop.functionMask.push_back({view_id, loopFunctionMask});
    
    // Recurse to the next loops
    for (size_t viewID=0; viewID < _qc->numberOfViews() + 1; ++viewID)
    {
        if (nextLoops[viewID])
        {
            dyn_bitset nextConsideredLoops = consideredLoops;
            nextConsideredLoops.set(viewID);

            if (outViewLoop[view_id][viewID])
            {
                ERROR("THERE IS A MISTAKE WITH NEXT CONSIDERED LOOPS IN DEP COMP\n");
                exit(1);
            }

            // TODO: check the next loops for the given DependentLoop
            // if any of them use the same loop -- then reuse this one

            bool found = false;
            size_t nextLoopID;
            for (const size_t& potNextLoop : depLoop.next)
            {
                if (depListOfLoops[potNextLoop].loopFactors == nextConsideredLoops)
                {
                    found = true;
                    nextLoopID = potNextLoop;
                }
            }

            if (!found)
            {
                nextLoopID = depListOfLoops.size();

                // otherwise add a new loop to the list with the correct loops and
                // loopVariable and then add this new loop to next of this loop
                DependentLoop newDepLoop(_qc->numberOfViews());
                newDepLoop.loopFactors = nextConsideredLoops;
                newDepLoop.loopVariable = viewID;

                // std::cout << "#########" << newDepLoop.loopFactors << std::endl;
                
                depListOfLoops.push_back(newDepLoop);

                // std::cout << depLoop.next.size() << std::endl;
                depListOfLoops[thisLoopID].next.push_back(nextLoopID);
            }

            prod_bitset branch =
                computeDependentLoops(view_id,presentFunctions,relationBag,
                                      contributingViews, varOrderBitset,
                                      addedOutLoops,nextLoopID);

            depListOfLoops[thisLoopID].branchFunctions |= branch;
        }
    }

    if (outViewLoop[view_id] == consideredLoops)
        depListOfLoops[thisLoopID].outView.set(view_id);

    if (consideredLoops == addedOutLoops && nonAddedOutLoops.any())
    {
        size_t nextOutLoop = nonAddedOutLoops.find_first();
        if (nextOutLoop != boost::dynamic_bitset<>::npos)
        {
            dyn_bitset nextConsideredLoops = consideredLoops;
            nextConsideredLoops.set(nextOutLoop);

            bool found = false;
            size_t nextLoopID;
            for (const size_t& potNextLoop : depLoop.next)
            {
                if (depListOfLoops[potNextLoop].loopFactors == nextConsideredLoops)
                {
                    found = true;
                    nextLoopID = potNextLoop;
                }
            }

            if (!found)
            {
                nextLoopID = depListOfLoops.size();

                // otherwise add a new loop to the list with the correct loops and
                // loopVariable and then add this new loop to next of this loop
                DependentLoop newDepLoop(_qc->numberOfViews());
                newDepLoop.loopFactors = nextConsideredLoops;
                newDepLoop.loopVariable = nextOutLoop;
                
                
                depListOfLoops.push_back(newDepLoop);

                depListOfLoops[thisLoopID].next.push_back(nextLoopID);
            }

            addedOutLoops.set(nextOutLoop);

            prod_bitset branch =                
                computeDependentLoops(view_id,presentFunctions,relationBag,
                                      contributingViews,varOrderBitset,
                                      addedOutLoops,nextLoopID);

            depListOfLoops[thisLoopID].branchFunctions |= branch;
        }
    }
    
    return depListOfLoops[thisLoopID].branchFunctions;
}